

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_value_numbering.cpp
# Opt level: O1

string * __thiscall
mocker::LocalValueNumbering::hash_abi_cxx11_
          (string *__return_storage_ptr__,LocalValueNumbering *this,
          shared_ptr<mocker::ir::IRInst> *inst,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *valueNumbers)

{
  uint uVar1;
  ulong *puVar2;
  ulong __val;
  pointer pcVar3;
  bool bVar4;
  undefined4 uVar5;
  pointer pbVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  char cVar8;
  int iVar9;
  long *plVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  size_type sVar12;
  byte bVar13;
  ulong uVar14;
  size_type *psVar15;
  pointer ppVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char cVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  size_type unaff_R13;
  ulong *puVar21;
  string *psVar22;
  pointer pbVar23;
  long lVar24;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vnStr;
  OpType op;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  string *local_320;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_300;
  undefined1 *local_2f8;
  undefined8 local_2f0;
  undefined1 local_2e8;
  undefined1 uStack_2e7;
  undefined1 uStack_2e6;
  undefined5 uStack_2e5;
  undefined2 uStack_2e0;
  undefined4 local_2de;
  undefined1 uStack_2d9;
  undefined1 *local_2d8;
  undefined8 local_2d0;
  undefined1 local_2c8;
  undefined1 uStack_2c7;
  undefined1 uStack_2c6;
  undefined5 uStack_2c5;
  undefined2 uStack_2c0;
  undefined4 uStack_2be;
  undefined1 local_2b9;
  undefined1 *local_2b8;
  undefined8 local_2b0;
  undefined1 local_2a8;
  undefined1 uStack_2a7;
  undefined6 uStack_2a6;
  undefined4 local_29e;
  undefined2 local_29a;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_298;
  undefined1 *local_290;
  undefined8 local_288;
  undefined1 local_280;
  undefined1 uStack_27f;
  undefined1 uStack_27e;
  undefined5 uStack_27d;
  undefined2 uStack_278;
  undefined4 local_276;
  undefined1 uStack_271;
  undefined1 *local_270;
  undefined8 local_268;
  undefined1 local_260;
  undefined1 uStack_25f;
  undefined1 uStack_25e;
  undefined5 uStack_25d;
  undefined4 local_255;
  undefined1 local_251;
  initializer_list<std::pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  undefined1 *local_230;
  undefined8 local_228;
  undefined1 local_220;
  undefined1 uStack_21f;
  undefined6 uStack_21e;
  undefined4 local_216;
  undefined2 local_212;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  undefined2 uStack_1f0;
  undefined4 uStack_1ee;
  char cStack_1ea;
  char cStack_1e9;
  undefined4 local_1e8;
  undefined2 *local_1e0;
  undefined8 local_1d8;
  undefined2 local_1d0;
  undefined1 local_1ce;
  undefined7 uStack_1cd;
  undefined4 local_1c6;
  undefined1 uStack_1c1;
  undefined4 local_1c0;
  shared_ptr<mocker::ir::Addr> *local_1b8;
  undefined8 local_1b0;
  shared_ptr<mocker::ir::Addr> local_1a8;
  undefined4 local_198;
  undefined2 *local_190;
  undefined8 local_188;
  undefined2 local_180;
  undefined1 local_17e;
  undefined7 uStack_17d;
  undefined4 uStack_176;
  undefined1 local_171;
  undefined4 local_170;
  undefined2 *local_168;
  undefined8 local_160;
  undefined2 local_158;
  undefined1 uStack_156;
  undefined4 local_14d;
  undefined1 local_149;
  undefined4 local_148;
  undefined1 *local_140;
  undefined8 local_138;
  undefined1 local_130 [10];
  undefined4 local_126;
  undefined1 uStack_121;
  undefined4 local_120;
  undefined2 *local_118;
  undefined8 local_110;
  undefined2 local_108 [5];
  undefined4 local_fe;
  undefined2 local_fa;
  undefined4 local_f8;
  undefined2 *local_f0;
  undefined8 local_e8;
  undefined2 local_e0 [5];
  undefined4 local_d6;
  undefined2 local_d2;
  undefined4 local_d0;
  undefined2 *local_c8;
  undefined8 local_c0;
  undefined2 local_b8 [5];
  undefined4 local_ae;
  undefined2 local_aa;
  undefined4 local_a8;
  undefined2 *local_a0;
  undefined8 local_98;
  long local_90;
  undefined4 local_86;
  undefined2 local_82;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70;
  undefined1 uStack_6f;
  undefined6 uStack_6e;
  undefined4 local_66;
  undefined2 local_62;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined1 uStack_4f;
  undefined6 uStack_4e;
  undefined4 local_46;
  undefined2 local_42;
  initializer_list<std::pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)(valueNumbers->
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(valueNumbers->
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3);
  local_320 = __return_storage_ptr__;
  local_300 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)inst;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&local_318,(size_type)paVar18);
  puVar21 = (valueNumbers->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
            _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (valueNumbers->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  local_298 = valueNumbers;
  if (puVar21 != puVar2) {
    unaff_R13 = 0x346dc5d63886594b;
    do {
      __val = *puVar21;
      cVar17 = '\x01';
      if (9 < __val) {
        uVar14 = __val;
        cVar8 = '\x04';
        do {
          cVar17 = cVar8;
          if (uVar14 < 100) {
            cVar17 = cVar17 + -2;
            goto LAB_0016e1c0;
          }
          if (uVar14 < 1000) {
            cVar17 = cVar17 + -1;
            goto LAB_0016e1c0;
          }
          if (uVar14 < 10000) goto LAB_0016e1c0;
          bVar4 = 99999 < uVar14;
          uVar14 = uVar14 / 10000;
          cVar8 = cVar17 + '\x04';
        } while (bVar4);
        cVar17 = cVar17 + '\x01';
      }
LAB_0016e1c0:
      local_210._M_allocated_capacity = (size_type)&local_200;
      std::__cxx11::string::_M_construct((ulong)&local_210,cVar17);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_210._M_allocated_capacity,local_210._8_4_,__val);
      paVar18 = &local_210;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_318,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_allocated_capacity != &local_200) {
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_200._M_allocated_capacity + 1);
        operator_delete((void *)local_210._M_allocated_capacity,(ulong)paVar18);
      }
      puVar21 = puVar21 + 1;
    } while (puVar21 != puVar2);
  }
  paVar7 = local_300;
  psVar22 = local_320;
  sVar12 = local_300->_M_allocated_capacity;
  if (*(int *)(sVar12 + 8) == 3) {
    this_00 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_300 + 8))->_M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
  }
  else {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    sVar12 = 0;
  }
  if (sVar12 != 0) {
    hash_abi_cxx11_(local_320,(LocalValueNumbering *)paVar18,
                    (shared_ptr<mocker::ir::Addr> *)(sVar12 + 0x28));
    goto joined_r0x0016e889;
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  sVar12 = paVar7->_M_allocated_capacity;
  if (*(int *)(sVar12 + 8) == 4) {
    this_00 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)paVar7 + 8))->_M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
  }
  else {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    sVar12 = 0;
  }
  if (sVar12 == 0) {
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    unaff_R13 = paVar7->_M_allocated_capacity;
    if (*(int *)(unaff_R13 + 8) == 5) {
      this_00 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)paVar7 + 8))->_M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
    }
    else {
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      unaff_R13 = 0;
    }
    if (unaff_R13 == 0) {
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      unaff_R13 = paVar7->_M_allocated_capacity;
      if (*(int *)(unaff_R13 + 8) == 6) {
        this_00 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)paVar7 + 8))->_M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
      }
      else {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        unaff_R13 = 0;
      }
      if (unaff_R13 == 0) {
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        sVar12 = paVar7->_M_allocated_capacity;
        if (*(int *)(sVar12 + 8) == 0xf) {
          this_00 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)paVar7 + 8))->_M_pi;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
        }
        else {
          sVar12 = 0;
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        if (sVar12 == 0) {
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/local_value_numbering.cpp"
                        ,0x86,
                        "std::string mocker::LocalValueNumbering::hash(const std::shared_ptr<ir::IRInst> &, const std::vector<std::size_t> &)"
                       );
        }
        local_300 = &psVar22->field_2;
        (psVar22->_M_dataplus)._M_p = (pointer)local_300;
        std::__cxx11::string::_M_construct<char_const*>((string *)psVar22,"phi,","");
        pbVar6 = local_318.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        psVar22 = local_320;
        if (local_318.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_318.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pbVar23 = local_318.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            pcVar3 = (pbVar23->_M_dataplus)._M_p;
            local_210._M_allocated_capacity = (size_type)&local_200;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_210,pcVar3,pcVar3 + pbVar23->_M_string_length);
            std::__cxx11::string::append(local_210._M_local_buf);
            std::__cxx11::string::_M_append((char *)local_320,local_210._M_allocated_capacity);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._M_allocated_capacity != &local_200) {
              operator_delete((void *)local_210._M_allocated_capacity,
                              local_200._M_allocated_capacity + 1);
            }
            pbVar23 = pbVar23 + 1;
            psVar22 = local_320;
          } while (pbVar23 != pbVar6);
        }
        goto joined_r0x0016e889;
      }
      if (hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
          ::names_abi_cxx11_ == '\0') goto LAB_0016ef5c;
LAB_0016e604:
      if ((long)local_318.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_318.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0x40) {
        __assert_fail("vnStr.size() == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/local_value_numbering.cpp"
                      ,0x74,
                      "std::string mocker::LocalValueNumbering::hash(const std::shared_ptr<ir::IRInst> &, const std::vector<std::size_t> &)"
                     );
      }
      uVar1 = *(uint *)(unaff_R13 + 0x28);
      local_2f8 = (undefined1 *)CONCAT44(local_2f8._4_4_,uVar1);
      if (uVar1 == 5) {
        std::operator+(&local_340,"<=",
                       local_318.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_340);
        local_210._M_allocated_capacity = (size_type)&local_200;
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 == paVar18) {
          local_200._M_allocated_capacity = paVar18->_M_allocated_capacity;
          lVar24 = plVar10[3];
          local_200._8_2_ = (undefined2)lVar24;
          local_200._M_local_buf[10] = (char)((ulong)lVar24 >> 0x10);
          local_200._M_local_buf[0xb] = (char)((ulong)lVar24 >> 0x18);
          local_200._12_4_ = (undefined4)((ulong)lVar24 >> 0x20);
        }
        else {
          local_200._M_allocated_capacity = paVar18->_M_allocated_capacity;
          local_210._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar10;
        }
        local_210._8_8_ = plVar10[1];
        *plVar10 = (long)paVar18;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    (local_210._M_local_buf,
                                     (ulong)((local_318.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            _M_dataplus)._M_p);
      }
      else if (uVar1 == 3) {
        std::operator+(&local_340,"<",
                       local_318.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_340);
        local_210._M_allocated_capacity = (size_type)&local_200;
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 == paVar18) {
          local_200._M_allocated_capacity = paVar18->_M_allocated_capacity;
          lVar24 = plVar10[3];
          local_200._8_2_ = (undefined2)lVar24;
          local_200._M_local_buf[10] = (char)((ulong)lVar24 >> 0x10);
          local_200._M_local_buf[0xb] = (char)((ulong)lVar24 >> 0x18);
          local_200._12_4_ = (undefined4)((ulong)lVar24 >> 0x20);
        }
        else {
          local_200._M_allocated_capacity = paVar18->_M_allocated_capacity;
          local_210._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar10;
        }
        local_210._8_8_ = plVar10[1];
        *plVar10 = (long)paVar18;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    (local_210._M_local_buf,
                                     (ulong)((local_318.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            _M_dataplus)._M_p);
      }
      else {
        if ((uVar1 < 2) &&
           (puVar21 = (local_298->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                      ._M_impl.super__Vector_impl_data._M_start, puVar21[1] < *puVar21)) {
          std::__cxx11::string::swap
                    ((string *)
                     local_318.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
        }
        pbVar11 = SmallMap<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::at(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                        ::names_abi_cxx11_,(OpType *)&local_2f8);
        std::operator+(&local_340,pbVar11,
                       local_318.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_340);
        local_210._M_allocated_capacity = (size_type)&local_200;
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 == paVar18) {
          local_200._M_allocated_capacity = paVar18->_M_allocated_capacity;
          lVar24 = plVar10[3];
          local_200._8_2_ = (undefined2)lVar24;
          local_200._M_local_buf[10] = (char)((ulong)lVar24 >> 0x10);
          local_200._M_local_buf[0xb] = (char)((ulong)lVar24 >> 0x18);
          local_200._12_4_ = (undefined4)((ulong)lVar24 >> 0x20);
        }
        else {
          local_200._M_allocated_capacity = paVar18->_M_allocated_capacity;
          local_210._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar10;
        }
        local_210._8_8_ = plVar10[1];
        *plVar10 = (long)paVar18;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    (local_210._M_local_buf,
                                     (ulong)local_318.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus
                                            ._M_p);
      }
    }
    else {
      if (hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
          ::names_abi_cxx11_ == '\0') goto LAB_0016e96d;
LAB_0016e3b7:
      if ((hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
           ::associative == '\0') &&
         (iVar9 = __cxa_guard_acquire(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                                       ::associative), iVar9 != 0)) {
        local_340._M_dataplus._M_p = (pointer)&local_210;
        local_210._M_allocated_capacity = 0;
        local_210._8_8_ = (char *)0x1;
        local_200._M_allocated_capacity = 2;
        local_200._8_2_ = 5;
        local_200._M_local_buf[10] = '\0';
        local_200._M_local_buf[0xb] = '\0';
        local_200._12_4_ = 0;
        uStack_1f0 = 7;
        uStack_1ee = 0;
        cStack_1ea = '\0';
        cStack_1e9 = '\0';
        local_340._M_string_length = 5;
        SmallMap<mocker::ir::ArithBinaryInst::OpType,_int>::SmallMap
                  (&hash::associative,
                   (initializer_list<std::pair<mocker::ir::ArithBinaryInst::OpType,_int>_> *)
                   &local_340);
        __cxa_atexit(SmallMap<mocker::ir::ArithBinaryInst::OpType,_int>::~SmallMap,
                     &hash::associative,&__dso_handle);
        __cxa_guard_release(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                             ::associative);
        psVar22 = local_320;
      }
      if ((long)local_318.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_318.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0x40) {
        __assert_fail("vnStr.size() == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/local_value_numbering.cpp"
                      ,0x6a,
                      "std::string mocker::LocalValueNumbering::hash(const std::shared_ptr<ir::IRInst> &, const std::vector<std::size_t> &)"
                     );
      }
      bVar4 = hash::associative.mp.
              super__Vector_base<std::pair<mocker::ir::ArithBinaryInst::OpType,_int>,_std::allocator<std::pair<mocker::ir::ArithBinaryInst::OpType,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              hash::associative.mp.
              super__Vector_base<std::pair<mocker::ir::ArithBinaryInst::OpType,_int>,_std::allocator<std::pair<mocker::ir::ArithBinaryInst::OpType,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      if (hash::associative.mp.
          super__Vector_base<std::pair<mocker::ir::ArithBinaryInst::OpType,_int>,_std::allocator<std::pair<mocker::ir::ArithBinaryInst::OpType,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          hash::associative.mp.
          super__Vector_base<std::pair<mocker::ir::ArithBinaryInst::OpType,_int>,_std::allocator<std::pair<mocker::ir::ArithBinaryInst::OpType,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0016e413:
        if (bVar4) goto LAB_0016e418;
      }
      else {
        ppVar16 = hash::associative.mp.
                  super__Vector_base<std::pair<mocker::ir::ArithBinaryInst::OpType,_int>,_std::allocator<std::pair<mocker::ir::ArithBinaryInst::OpType,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((hash::associative.mp.
             super__Vector_base<std::pair<mocker::ir::ArithBinaryInst::OpType,_int>,_std::allocator<std::pair<mocker::ir::ArithBinaryInst::OpType,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->first != *(OpType *)(unaff_R13 + 0x28)) {
          do {
            ppVar16 = ppVar16 + 1;
            bVar4 = ppVar16 !=
                    hash::associative.mp.
                    super__Vector_base<std::pair<mocker::ir::ArithBinaryInst::OpType,_int>,_std::allocator<std::pair<mocker::ir::ArithBinaryInst::OpType,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
            if (ppVar16 ==
                hash::associative.mp.
                super__Vector_base<std::pair<mocker::ir::ArithBinaryInst::OpType,_int>,_std::allocator<std::pair<mocker::ir::ArithBinaryInst::OpType,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) break;
          } while (ppVar16->first != *(OpType *)(unaff_R13 + 0x28));
          goto LAB_0016e413;
        }
LAB_0016e418:
        puVar21 = (local_298->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        if (puVar21[1] < *puVar21) {
          std::__cxx11::string::swap
                    ((string *)
                     local_318.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      local_2f8 = (undefined1 *)CONCAT44(local_2f8._4_4_,*(undefined4 *)(unaff_R13 + 0x28));
      pbVar11 = SmallMap<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::at(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                      ::names_abi_cxx11_,(OpType *)&local_2f8);
      if (local_318.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_318.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0016ef49:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
LAB_0016ef5c:
        iVar9 = __cxa_guard_acquire(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                                     ::names_abi_cxx11_);
        if (iVar9 != 0) {
          local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
          local_340.field_2._M_local_buf[1] = '=';
          local_340.field_2._M_local_buf[2] = '\0';
          local_210._8_8_ = local_200._M_local_buf + 8;
          local_210._M_allocated_capacity = local_210._M_allocated_capacity & 0xffffffff00000000;
          local_200._8_2_ = 0x3d3d;
          local_200._M_local_buf[10] = '\0';
          local_200._M_local_buf[0xb] = (char)local_340.field_2._M_allocated_capacity._3_5_;
          local_200._12_4_ = (undefined4)((uint5)local_340.field_2._3_5_ >> 8);
          uStack_1f0 = local_340.field_2._8_2_;
          uStack_1ee = local_340.field_2._10_4_;
          cStack_1ea = local_340.field_2._M_local_buf[0xe];
          cStack_1e9 = local_340.field_2._M_local_buf[0xf];
          local_200._M_allocated_capacity = 2;
          local_340._M_string_length = 0;
          local_340.field_2._M_local_buf[0] = '\0';
          local_2f8 = &local_2e8;
          uStack_2e7 = 0x3d;
          uStack_2e6 = 0;
          local_1e8 = 1;
          local_1e0 = &local_1d0;
          local_1d0 = 0x3d21;
          local_1ce = 0;
          uStack_1cd = CONCAT25(uStack_2e0,uStack_2e5);
          local_1c6 = local_2de;
          uStack_1c1 = uStack_2d9;
          local_1d8 = 2;
          local_2f0 = 0;
          local_2e8 = 0;
          local_2b8 = &local_2a8;
          uStack_2a7 = 0;
          local_1c0 = 2;
          local_1b8 = &local_1a8;
          local_1a8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_2_ =
               0x3c;
          local_1a8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi._2_4_ = local_29e;
          local_1a8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi._6_2_ = local_29a;
          local_1b0 = 1;
          local_2b0 = 0;
          local_2a8 = 0;
          local_2d8 = &local_2c8;
          uStack_2c7 = 0;
          local_198 = 3;
          local_190 = &local_180;
          local_180 = 0x3e;
          local_17e = uStack_2c6;
          uStack_17d = (undefined7)(CONCAT26(uStack_2c0,CONCAT51(uStack_2c5,uStack_2c6)) >> 8);
          uStack_176 = uStack_2be;
          local_171 = local_2b9;
          local_188 = 1;
          local_2d0 = 0;
          local_2c8 = 0;
          uStack_25f = 0x3d;
          uStack_25e = 0;
          local_170 = 4;
          local_168 = &local_158;
          local_158 = 0x3d3c;
          uStack_156 = 0;
          local_14d = local_255;
          local_149 = local_251;
          local_160 = 2;
          local_268 = 0;
          local_260 = 0;
          uStack_27f = 0x3d;
          uStack_27e = 0;
          local_148 = 5;
          local_140 = local_130;
          local_130._0_2_ = 0x3d3e;
          local_130[2] = 0;
          local_130._3_7_ = CONCAT25(uStack_278,uStack_27d);
          local_126 = local_276;
          uStack_121 = uStack_271;
          local_138 = 2;
          local_288 = 0;
          local_280 = 0;
          local_250._M_array = (iterator)&local_210;
          local_250._M_len = 6;
          local_290 = &local_280;
          local_270 = &local_260;
          SmallMap<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::SmallMap(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                      ::names_abi_cxx11_,&local_250);
          lVar24 = -0xf0;
          plVar10 = (long *)local_130;
          do {
            if (plVar10 != (long *)plVar10[-2]) {
              operator_delete((long *)plVar10[-2],*plVar10 + 1);
            }
            plVar10 = plVar10 + -5;
            lVar24 = lVar24 + 0x28;
          } while (lVar24 != 0);
          if (local_290 != &local_280) {
            operator_delete(local_290,
                            CONCAT53(uStack_27d,CONCAT12(uStack_27e,CONCAT11(uStack_27f,local_280)))
                            + 1);
          }
          if (local_270 != &local_260) {
            operator_delete(local_270,
                            CONCAT53(uStack_25d,CONCAT12(uStack_25e,CONCAT11(uStack_25f,local_260)))
                            + 1);
          }
          if (local_2d8 != &local_2c8) {
            operator_delete(local_2d8,
                            CONCAT53(uStack_2c5,CONCAT12(uStack_2c6,CONCAT11(uStack_2c7,local_2c8)))
                            + 1);
          }
          if (local_2b8 != &local_2a8) {
            operator_delete(local_2b8,CONCAT62(uStack_2a6,CONCAT11(uStack_2a7,local_2a8)) + 1);
          }
          if (local_2f8 != &local_2e8) {
            operator_delete(local_2f8,
                            CONCAT53(uStack_2e5,CONCAT12(uStack_2e6,CONCAT11(uStack_2e7,local_2e8)))
                            + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._M_dataplus._M_p != &local_340.field_2) {
            operator_delete(local_340._M_dataplus._M_p,
                            CONCAT53(local_340.field_2._M_allocated_capacity._3_5_,
                                     CONCAT12(local_340.field_2._M_local_buf[2],
                                              CONCAT11(local_340.field_2._M_local_buf[1],
                                                       local_340.field_2._M_local_buf[0]))) + 1);
          }
          __cxa_atexit(SmallMap<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::~SmallMap,
                       &hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                        ::names_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                               ::names_abi_cxx11_);
          psVar22 = local_320;
        }
        goto LAB_0016e604;
      }
      std::operator+(&local_340,pbVar11,
                     local_318.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_340);
      local_210._M_allocated_capacity = (size_type)&local_200;
      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 == paVar18) {
        local_200._M_allocated_capacity = paVar18->_M_allocated_capacity;
        uVar5 = (undefined4)plVar10[3];
        local_200._12_4_ = *(undefined4 *)((long)plVar10 + 0x1c);
        local_200._8_2_ = (undefined2)uVar5;
        local_200._M_local_buf[10] = (char)((uint)uVar5 >> 0x10);
        local_200._M_local_buf[0xb] = (char)((uint)uVar5 >> 0x18);
      }
      else {
        local_200._M_allocated_capacity = paVar18->_M_allocated_capacity;
        local_210._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar10;
      }
      local_210._8_8_ = plVar10[1];
      *plVar10 = (long)paVar18;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      if ((ulong)((long)local_318.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_318.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) < 2) goto LAB_0016ef49;
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  (local_210._M_local_buf,
                                   (ulong)local_318.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus.
                                          _M_p);
    }
    (psVar22->_M_dataplus)._M_p = (pointer)&psVar22->field_2;
    psVar15 = (size_type *)(plVar10 + 2);
    if ((size_type *)*plVar10 == psVar15) {
      lVar24 = plVar10[3];
      (psVar22->field_2)._M_allocated_capacity = *psVar15;
      *(long *)((long)&psVar22->field_2 + 8) = lVar24;
    }
    else {
      (psVar22->_M_dataplus)._M_p = (pointer)*plVar10;
      (psVar22->field_2)._M_allocated_capacity = *psVar15;
    }
    psVar22->_M_string_length = plVar10[1];
    *plVar10 = (long)psVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_allocated_capacity != &local_200) {
      operator_delete((void *)local_210._M_allocated_capacity,local_200._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p == &local_340.field_2) goto joined_r0x0016e889;
    uVar19 = CONCAT53(local_340.field_2._M_allocated_capacity._3_5_,
                      CONCAT12(local_340.field_2._M_local_buf[2],
                               CONCAT11(local_340.field_2._M_local_buf[1],
                                        local_340.field_2._M_local_buf[0])));
    uVar20 = local_340._M_dataplus._M_p;
  }
  else {
    bVar13 = 0x7e;
    if (*(int *)(sVar12 + 0x28) == 0) {
      bVar13 = 0x2d;
    }
    local_210._8_8_ = (char *)0x1;
    local_200._M_local_buf[1] = 0;
    local_200._M_local_buf[0] = bVar13;
    local_210._M_allocated_capacity = (size_type)&local_200;
    if (local_318.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_318.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0016e96d:
      iVar9 = __cxa_guard_acquire(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                                   ::names_abi_cxx11_);
      if (iVar9 != 0) {
        local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
        local_340.field_2._M_local_buf[1] = '\0';
        local_210._8_8_ = local_200._M_local_buf + 8;
        local_210._M_allocated_capacity = local_210._M_allocated_capacity & 0xffffffff00000000;
        local_200._8_2_ = 0x7c;
        local_200._M_local_buf[10] = local_340.field_2._M_local_buf[2];
        local_200._M_local_buf[0xb] = (char)local_340.field_2._M_allocated_capacity._3_5_;
        local_200._12_4_ = (undefined4)((uint5)local_340.field_2._3_5_ >> 8);
        uStack_1f0 = local_340.field_2._8_2_;
        uStack_1ee = local_340.field_2._10_4_;
        cStack_1ea = local_340.field_2._M_local_buf[0xe];
        cStack_1e9 = local_340.field_2._M_local_buf[0xf];
        local_200._M_allocated_capacity = 1;
        local_340._M_string_length = 0;
        local_340.field_2._M_local_buf[0] = '\0';
        local_2f8 = &local_2e8;
        uStack_2e7 = 0;
        local_1e8 = 1;
        local_1e0 = &local_1d0;
        local_1d0 = 0x26;
        local_1ce = uStack_2e6;
        uStack_1cd = (undefined7)(CONCAT26(uStack_2e0,CONCAT51(uStack_2e5,uStack_2e6)) >> 8);
        local_1c6 = local_2de;
        uStack_1c1 = uStack_2d9;
        local_1d8 = 1;
        local_2f0 = 0;
        local_2e8 = 0;
        local_2b8 = &local_2a8;
        uStack_2a7 = 0;
        local_1c0 = 2;
        local_1b8 = &local_1a8;
        local_1a8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_2_ =
             0x5e;
        local_1a8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ._2_4_ = local_29e;
        local_1a8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ._6_2_ = local_29a;
        local_1b0 = 1;
        local_2b0 = 0;
        local_2a8 = 0;
        local_2d8 = &local_2c8;
        uStack_2c7 = 0x3c;
        uStack_2c6 = 0;
        local_198 = 3;
        local_190 = &local_180;
        local_180 = 0x3c3c;
        local_17e = 0;
        uStack_17d = CONCAT25(uStack_2c0,uStack_2c5);
        uStack_176 = uStack_2be;
        local_171 = local_2b9;
        local_188 = 2;
        local_2d0 = 0;
        local_2c8 = 0;
        local_270 = &local_260;
        uStack_25f = 0x3e;
        uStack_25e = 0;
        local_170 = 4;
        local_168 = &local_158;
        local_158 = 0x3e3e;
        uStack_156 = 0;
        local_14d = local_255;
        local_149 = local_251;
        local_160 = 2;
        local_268 = 0;
        local_260 = 0;
        local_290 = &local_280;
        uStack_27f = 0;
        local_148 = 5;
        local_140 = local_130;
        local_130._0_2_ = 0x2b;
        local_130[2] = uStack_27e;
        local_130._3_7_ = (undefined7)(CONCAT26(uStack_278,CONCAT51(uStack_27d,uStack_27e)) >> 8);
        local_126 = local_276;
        uStack_121 = uStack_271;
        local_138 = 1;
        local_288 = 0;
        local_280 = 0;
        local_250._M_array = (iterator)&local_240;
        local_240._M_local_buf[1] = '\0';
        local_120 = 6;
        local_118 = local_108;
        local_108[0] = 0x2d;
        local_fe = local_240._10_4_;
        local_fa = local_240._14_2_;
        local_110 = 1;
        local_250._M_len = 0;
        local_240._M_local_buf[0] = '\0';
        local_230 = &local_220;
        uStack_21f = 0;
        local_f8 = 7;
        local_f0 = local_e0;
        local_e0[0] = 0x2a;
        local_d6 = local_216;
        local_d2 = local_212;
        local_e8 = 1;
        local_228 = 0;
        local_220 = 0;
        uStack_4f = 0;
        local_d0 = 8;
        local_c8 = local_b8;
        local_b8[0] = 0x2f;
        local_ae = local_46;
        local_aa = local_42;
        local_c0 = 1;
        local_58 = 0;
        local_50 = 0;
        uStack_6f = 0;
        local_a8 = 9;
        local_a0 = (undefined2 *)&local_90;
        local_90._0_2_ = 0x25;
        local_86 = local_66;
        local_82 = local_62;
        local_98 = 1;
        local_78 = 0;
        local_70 = 0;
        local_40._M_array = (iterator)&local_210;
        local_40._M_len = 10;
        local_80 = &local_70;
        local_60 = &local_50;
        SmallMap<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::SmallMap(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                    ::names_abi_cxx11_,&local_40);
        lVar24 = -400;
        plVar10 = &local_90;
        do {
          if (plVar10 != (long *)plVar10[-2]) {
            operator_delete((long *)plVar10[-2],*plVar10 + 1);
          }
          plVar10 = plVar10 + -5;
          lVar24 = lVar24 + 0x28;
        } while (lVar24 != 0);
        if (local_80 != &local_70) {
          operator_delete(local_80,CONCAT62(uStack_6e,CONCAT11(uStack_6f,local_70)) + 1);
        }
        if (local_60 != &local_50) {
          operator_delete(local_60,CONCAT62(uStack_4e,CONCAT11(uStack_4f,local_50)) + 1);
        }
        if (local_230 != &local_220) {
          operator_delete(local_230,CONCAT62(uStack_21e,CONCAT11(uStack_21f,local_220)) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_array != &local_240) {
          operator_delete(local_250._M_array,
                          CONCAT62(local_240._M_allocated_capacity._2_6_,
                                   CONCAT11(local_240._M_local_buf[1],local_240._M_local_buf[0])) +
                          1);
        }
        if (local_290 != &local_280) {
          operator_delete(local_290,
                          CONCAT53(uStack_27d,CONCAT12(uStack_27e,CONCAT11(uStack_27f,local_280))) +
                          1);
        }
        if (local_270 != &local_260) {
          operator_delete(local_270,
                          CONCAT53(uStack_25d,CONCAT12(uStack_25e,CONCAT11(uStack_25f,local_260))) +
                          1);
        }
        if (local_2d8 != &local_2c8) {
          operator_delete(local_2d8,
                          CONCAT53(uStack_2c5,CONCAT12(uStack_2c6,CONCAT11(uStack_2c7,local_2c8))) +
                          1);
        }
        if (local_2b8 != &local_2a8) {
          operator_delete(local_2b8,CONCAT62(uStack_2a6,CONCAT11(uStack_2a7,local_2a8)) + 1);
        }
        if (local_2f8 != &local_2e8) {
          operator_delete(local_2f8,
                          CONCAT53(uStack_2e5,CONCAT12(uStack_2e6,CONCAT11(uStack_2e7,local_2e8))) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != &local_340.field_2) {
          operator_delete(local_340._M_dataplus._M_p,
                          CONCAT53(local_340.field_2._M_allocated_capacity._3_5_,
                                   CONCAT12(local_340.field_2._M_local_buf[2],
                                            CONCAT11(local_340.field_2._M_local_buf[1],
                                                     local_340.field_2._M_local_buf[0]))) + 1);
        }
        __cxa_atexit(SmallMap<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::~SmallMap,
                     &hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                      ::names_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&hash[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                             ::names_abi_cxx11_);
        psVar22 = local_320;
      }
      goto LAB_0016e3b7;
    }
    plVar10 = (long *)std::__cxx11::string::_M_append
                                (local_210._M_local_buf,
                                 (ulong)((local_318.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p);
    (psVar22->_M_dataplus)._M_p = (pointer)&psVar22->field_2;
    psVar15 = (size_type *)(plVar10 + 2);
    if ((size_type *)*plVar10 == psVar15) {
      lVar24 = plVar10[3];
      (psVar22->field_2)._M_allocated_capacity = *psVar15;
      *(long *)((long)&psVar22->field_2 + 8) = lVar24;
    }
    else {
      (psVar22->_M_dataplus)._M_p = (pointer)*plVar10;
      (psVar22->field_2)._M_allocated_capacity = *psVar15;
    }
    psVar22->_M_string_length = plVar10[1];
    *plVar10 = (long)psVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    uVar19 = local_200._M_allocated_capacity;
    uVar20 = local_210._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_allocated_capacity == &local_200) goto joined_r0x0016e889;
  }
  operator_delete((void *)uVar20,uVar19 + 1);
joined_r0x0016e889:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  return psVar22;
}

Assistant:

std::string
LocalValueNumbering::hash(const std::shared_ptr<ir::IRInst> &inst,
                          const std::vector<std::size_t> &valueNumbers) {
  using namespace std::string_literals;
  std::vector<std::string> vnStr;
  vnStr.reserve(valueNumbers.size());
  for (auto valueNumber : valueNumbers)
    vnStr.emplace_back(std::to_string(valueNumber));

  if (auto p = ir::dyc<ir::Assign>(inst)) {
    return hash(p->getOperand());
  }
  if (auto p = ir::dyc<ir::ArithUnaryInst>(inst)) {
    return (p->getOp() == ir::ArithUnaryInst::Neg ? "-"s : "~"s) + vnStr.at(0);
  }
  if (auto p = ir::dyc<ir::ArithBinaryInst>(inst)) {
    static const SmallMap<ir::ArithBinaryInst::OpType, std::string> names{
        {ir::ArithBinaryInst::BitOr, "|"s}, {ir::ArithBinaryInst::BitAnd, "&"s},
        {ir::ArithBinaryInst::Xor, "^"s},   {ir::ArithBinaryInst::Shl, "<<"s},
        {ir::ArithBinaryInst::Shr, ">>"s},  {ir::ArithBinaryInst::Add, "+"s},
        {ir::ArithBinaryInst::Sub, "-"s},   {ir::ArithBinaryInst::Mul, "*"s},
        {ir::ArithBinaryInst::Div, "/"s},   {ir::ArithBinaryInst::Mod, "%"s}};
    static const SmallMap<ir::ArithBinaryInst::OpType, int> associative{
        {ir::ArithBinaryInst::BitOr, 0}, {ir::ArithBinaryInst::BitAnd, 0},
        {ir::ArithBinaryInst::Xor, 0},   {ir::ArithBinaryInst::Add, 0},
        {ir::ArithBinaryInst::Mul, 0},
    };
    assert(vnStr.size() == 2);
    if (associative.in(p->getOp()) && valueNumbers[0] > valueNumbers[1])
      std::swap(vnStr[0], vnStr[1]);
    return names.at(p->getOp()) + vnStr.at(0) + "," + vnStr.at(1);
  }
  if (auto p = ir::dyc<ir::RelationInst>(inst)) {
    static const SmallMap<ir::RelationInst::OpType, std::string> names{
        {ir::RelationInst::Eq, "=="s}, {ir::RelationInst::Ne, "!="s},
        {ir::RelationInst::Lt, "<"s},  {ir::RelationInst::Gt, ">"s},
        {ir::RelationInst::Le, "<="s}, {ir::RelationInst::Ge, ">="s}};
    assert(vnStr.size() == 2);
    auto op = p->getOp();
    if (op == ir::RelationInst::Gt)
      return "<" + vnStr[1] + "," + vnStr[0];
    if (op == ir::RelationInst::Ge)
      return "<=" + vnStr[1] + "," + vnStr[0];

    if ((op == ir::RelationInst::Eq || op == ir::RelationInst::Ne) &&
        valueNumbers[0] > valueNumbers[1])
      std::swap(vnStr[0], vnStr[1]);
    return names.at(op) + vnStr[0] + "," + vnStr[1];
  }
  if (auto p = ir::dyc<ir::Phi>(inst)) {
    std::string res = "phi,";
    for (auto &s : vnStr)
      res += s + ",";
    return res;
  }
  assert(false);
}